

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::HasProperty(RecyclableObject *instance,PropertyId propertyId)

{
  BOOL BVar1;
  PropertyQueryFlags val;
  PropertyQueryFlags result;
  PropertyId propertyId_local;
  RecyclableObject *instance_local;
  
  _result = instance;
  while( true ) {
    BVar1 = IsNull(_result);
    if (BVar1 != 0) {
      return 0;
    }
    val = (*(_result->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xb])(_result,(ulong)(uint)propertyId,0);
    if (val != Property_NotFound) break;
    _result = GetPrototypeNoTrap(_result);
  }
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::HasProperty(RecyclableObject* instance, PropertyId propertyId)
    {
        while (!JavascriptOperators::IsNull(instance))
        {
            PropertyQueryFlags result = instance->HasPropertyQuery(propertyId, nullptr /*info*/);
            if (result != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result); // return false if instance is typed array and HasPropertyQuery() returns PropertyQueryFlags::Property_Found_Undefined
            }

            instance = JavascriptOperators::GetPrototypeNoTrap(instance);
        }
        return false;
    }